

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O2

Error * __thiscall
libsbox::Task::
deserialize_response<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Error *__return_storage_ptr__,Task *this,Value *value)

{
  bool bVar1;
  int iVar2;
  Type pGVar3;
  int64_t iVar4;
  allocator<char> local_39;
  string local_38;
  
  if ((value->data_).f.flags == 3) {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(value,"time_usage_ms");
    if (bVar1) {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)value,"time_usage_ms");
      if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x80000000000000)
          == (undefined1  [16])0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"Response JSON is incorrect",&local_39);
        Error::Error(__return_storage_ptr__,&local_38);
      }
      else {
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)value,"time_usage_ms");
        iVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt64(pGVar3);
        this->time_usage_ms_ = iVar4;
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember(value,"time_usage_sys_ms");
        if (bVar1) {
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)value,"time_usage_sys_ms");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x80000000000000) ==
              (undefined1  [16])0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"Response JSON is incorrect",&local_39);
            Error::Error(__return_storage_ptr__,&local_38);
          }
          else {
            pGVar3 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)value,"time_usage_sys_ms");
            iVar4 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetInt64(pGVar3);
            this->time_usage_sys_ms_ = iVar4;
            bVar1 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::HasMember(value,"time_usage_user_ms");
            if (bVar1) {
              pGVar3 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>
                                 ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   *)value,"time_usage_user_ms");
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x80000000000000) ==
                  (undefined1  [16])0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_38,"Response JSON is incorrect",&local_39);
                Error::Error(__return_storage_ptr__,&local_38);
              }
              else {
                pGVar3 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>
                                   ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     *)value,"time_usage_user_ms");
                iVar4 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetInt64(pGVar3);
                this->time_usage_user_ms_ = iVar4;
                bVar1 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::HasMember(value,"wall_time_usage_ms");
                if (bVar1) {
                  pGVar3 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)value,"wall_time_usage_ms");
                  if ((undefined1  [16])
                      ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x80000000000000) ==
                      (undefined1  [16])0x0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_38,"Response JSON is incorrect",&local_39);
                    Error::Error(__return_storage_ptr__,&local_38);
                  }
                  else {
                    pGVar3 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             ::operator[]<char_const>
                                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                         *)value,"wall_time_usage_ms");
                    iVar4 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::GetInt64(pGVar3);
                    this->wall_time_usage_ms_ = iVar4;
                    bVar1 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::HasMember(value,"memory_usage_kb");
                    if (bVar1) {
                      pGVar3 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>
                                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           *)value,"memory_usage_kb");
                      if ((undefined1  [16])
                          ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x80000000000000) ==
                          (undefined1  [16])0x0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_38,"Response JSON is incorrect",&local_39);
                        Error::Error(__return_storage_ptr__,&local_38);
                      }
                      else {
                        pGVar3 = rapidjson::
                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 ::operator[]<char_const>
                                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                             *)value,"memory_usage_kb");
                        iVar4 = rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::GetInt64(pGVar3);
                        this->memory_usage_kb_ = iVar4;
                        bVar1 = rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::HasMember(value,"time_limit_exceeded");
                        if (bVar1) {
                          pGVar3 = rapidjson::
                                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   ::operator[]<char_const>
                                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                               *)value,"time_limit_exceeded");
                          if ((undefined1  [16])
                              ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x8000000000000)
                              == (undefined1  [16])0x0) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_38,"Response JSON is incorrect",&local_39);
                            Error::Error(__return_storage_ptr__,&local_38);
                          }
                          else {
                            pGVar3 = rapidjson::
                                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     ::operator[]<char_const>
                                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                 *)value,"time_limit_exceeded");
                            bVar1 = rapidjson::
                                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ::GetBool(pGVar3);
                            this->time_limit_exceeded_ = bVar1;
                            bVar1 = rapidjson::
                                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ::HasMember(value,"wall_time_limit_exceeded");
                            if (bVar1) {
                              pGVar3 = rapidjson::
                                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       ::operator[]<char_const>
                                                 ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"wall_time_limit_exceeded");
                              if ((undefined1  [16])
                                  ((undefined1  [16])pGVar3->data_ &
                                  (undefined1  [16])0x8000000000000) == (undefined1  [16])0x0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_38,"Response JSON is incorrect",
                                           &local_39);
                                Error::Error(__return_storage_ptr__,&local_38);
                              }
                              else {
                                pGVar3 = rapidjson::
                                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                         ::operator[]<char_const>
                                                   ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"wall_time_limit_exceeded");
                                bVar1 = rapidjson::
                                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        ::GetBool(pGVar3);
                                this->wall_time_limit_exceeded_ = bVar1;
                                bVar1 = rapidjson::
                                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        ::HasMember(value,"exited");
                                if (bVar1) {
                                  pGVar3 = rapidjson::
                                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           ::operator[]<char_const>
                                                     ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"exited");
                                  if ((undefined1  [16])
                                      ((undefined1  [16])pGVar3->data_ &
                                      (undefined1  [16])0x8000000000000) == (undefined1  [16])0x0) {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_38,"Response JSON is incorrect",
                                               &local_39);
                                    Error::Error(__return_storage_ptr__,&local_38);
                                  }
                                  else {
                                    pGVar3 = rapidjson::
                                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                             ::operator[]<char_const>
                                                       ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"exited");
                                    bVar1 = rapidjson::
                                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            ::GetBool(pGVar3);
                                    this->exited_ = bVar1;
                                    bVar1 = rapidjson::
                                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            ::HasMember(value,"exit_code");
                                    if (bVar1) {
                                      pGVar3 = rapidjson::
                                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                               ::operator[]<char_const>
                                                         ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"exit_code");
                                      if ((undefined1  [16])
                                          ((undefined1  [16])pGVar3->data_ &
                                          (undefined1  [16])0x20000000000000) ==
                                          (undefined1  [16])0x0) {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_38,"Response JSON is incorrect",
                                                   &local_39);
                                        Error::Error(__return_storage_ptr__,&local_38);
                                      }
                                      else {
                                        pGVar3 = rapidjson::
                                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                 ::operator[]<char_const>
                                                           ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"exit_code");
                                        iVar2 = rapidjson::
                                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                ::GetInt(pGVar3);
                                        this->exit_code_ = iVar2;
                                        bVar1 = rapidjson::
                                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                ::HasMember(value,"signaled");
                                        if (bVar1) {
                                          pGVar3 = rapidjson::
                                                                                                      
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"signaled");
                                          if ((undefined1  [16])
                                              ((undefined1  [16])pGVar3->data_ &
                                              (undefined1  [16])0x8000000000000) ==
                                              (undefined1  [16])0x0) {
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_38,
                                                       "Response JSON is incorrect",&local_39);
                                            Error::Error(__return_storage_ptr__,&local_38);
                                          }
                                          else {
                                            pGVar3 = rapidjson::
                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"signaled");
                                            bVar1 = rapidjson::
                                                                                                        
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::GetBool(pGVar3);
                                            this->signaled_ = bVar1;
                                            bVar1 = rapidjson::
                                                                                                        
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember(value,"term_signal");
                                            if (bVar1) {
                                              pGVar3 = rapidjson::
                                                                                                              
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"term_signal");
                                              if ((undefined1  [16])
                                                  ((undefined1  [16])pGVar3->data_ &
                                                  (undefined1  [16])0x20000000000000) ==
                                                  (undefined1  [16])0x0) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_38,
                                                           "Response JSON is incorrect",&local_39);
                                                Error::Error(__return_storage_ptr__,&local_38);
                                              }
                                              else {
                                                pGVar3 = rapidjson::
                                                                                                                  
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"term_signal");
                                                iVar2 = rapidjson::
                                                                                                                
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::GetInt(pGVar3);
                                                this->term_signal_ = iVar2;
                                                bVar1 = rapidjson::
                                                                                                                
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember(value,"oom_killed");
                                                if (bVar1) {
                                                  pGVar3 = rapidjson::
                                                                                                                      
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"oom_killed");
                                                  if ((undefined1  [16])
                                                      ((undefined1  [16])pGVar3->data_ &
                                                      (undefined1  [16])0x8000000000000) ==
                                                      (undefined1  [16])0x0) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_38,
                                                               "Response JSON is incorrect",
                                                               &local_39);
                                                    Error::Error(__return_storage_ptr__,&local_38);
                                                  }
                                                  else {
                                                    pGVar3 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"oom_killed");
                                                  bVar1 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::GetBool(pGVar3);
                                                  this->oom_killed_ = bVar1;
                                                  bVar1 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember(value,"memory_limit_hit");
                                                  if (bVar1) {
                                                    pGVar3 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"memory_limit_hit");
                                                  if ((undefined1  [16])
                                                      ((undefined1  [16])pGVar3->data_ &
                                                      (undefined1  [16])0x8000000000000) !=
                                                      (undefined1  [16])0x0) {
                                                    pGVar3 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)value,"memory_limit_hit");
                                                  bVar1 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::GetBool(pGVar3);
                                                  this->memory_limit_hit_ = bVar1;
                                                  (__return_storage_ptr__->error_).field_2.
                                                  _M_allocated_capacity = 0;
                                                  *(undefined8 *)
                                                   ((long)&(__return_storage_ptr__->error_).field_2
                                                   + 8) = 0;
                                                  (__return_storage_ptr__->error_)._M_dataplus._M_p
                                                       = (pointer)&(__return_storage_ptr__->error_).
                                                                   field_2;
                                                  (__return_storage_ptr__->error_)._M_string_length
                                                       = 0;
                                                  return __return_storage_ptr__;
                                                  }
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_38,
                                                             "Response JSON is incorrect",&local_39)
                                                  ;
                                                  Error::Error(__return_storage_ptr__,&local_38);
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_38,
                                                               "Response JSON is incorrect",
                                                               &local_39);
                                                    Error::Error(__return_storage_ptr__,&local_38);
                                                  }
                                                  }
                                                }
                                                else {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_38,
                                                             "Response JSON is incorrect",&local_39)
                                                  ;
                                                  Error::Error(__return_storage_ptr__,&local_38);
                                                }
                                              }
                                            }
                                            else {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_38,
                                                         "Response JSON is incorrect",&local_39);
                                              Error::Error(__return_storage_ptr__,&local_38);
                                            }
                                          }
                                        }
                                        else {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_38,
                                                     "Response JSON is incorrect",&local_39);
                                          Error::Error(__return_storage_ptr__,&local_38);
                                        }
                                      }
                                    }
                                    else {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_38,"Response JSON is incorrect",
                                                 &local_39);
                                      Error::Error(__return_storage_ptr__,&local_38);
                                    }
                                  }
                                }
                                else {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_38,"Response JSON is incorrect",
                                             &local_39);
                                  Error::Error(__return_storage_ptr__,&local_38);
                                }
                              }
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_38,"Response JSON is incorrect",&local_39)
                              ;
                              Error::Error(__return_storage_ptr__,&local_38);
                            }
                          }
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_38,"Response JSON is incorrect",&local_39);
                          Error::Error(__return_storage_ptr__,&local_38);
                        }
                      }
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_38,"Response JSON is incorrect",&local_39);
                      Error::Error(__return_storage_ptr__,&local_38);
                    }
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_38,"Response JSON is incorrect",&local_39);
                  Error::Error(__return_storage_ptr__,&local_38);
                }
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_38,"Response JSON is incorrect",&local_39);
              Error::Error(__return_storage_ptr__,&local_38);
            }
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"Response JSON is incorrect",&local_39);
          Error::Error(__return_storage_ptr__,&local_38);
        }
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Response JSON is incorrect",&local_39);
      Error::Error(__return_storage_ptr__,&local_38);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Response JSON is incorrect",&local_39);
    Error::Error(__return_storage_ptr__,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Error Task::deserialize_response(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(time_usage_ms_, value, "time_usage_ms", Int64);
    GET_MEMBER(time_usage_sys_ms_, value, "time_usage_sys_ms", Int64);
    GET_MEMBER(time_usage_user_ms_, value, "time_usage_user_ms", Int64);
    GET_MEMBER(wall_time_usage_ms_, value, "wall_time_usage_ms", Int64);
    GET_MEMBER(memory_usage_kb_, value, "memory_usage_kb", Int64);
    GET_MEMBER(time_limit_exceeded_, value, "time_limit_exceeded", Bool);
    GET_MEMBER(wall_time_limit_exceeded_, value, "wall_time_limit_exceeded", Bool);
    GET_MEMBER(exited_, value, "exited", Bool);
    GET_MEMBER(exit_code_, value, "exit_code", Int);
    GET_MEMBER(signaled_, value, "signaled", Bool);
    GET_MEMBER(term_signal_, value, "term_signal", Int);
    GET_MEMBER(oom_killed_, value, "oom_killed", Bool);
    GET_MEMBER(memory_limit_hit_, value, "memory_limit_hit", Bool);
    return Error();
}